

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_hexdec(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  byte *zSrc;
  ushort **ppuVar2;
  char in_CL;
  undefined7 in_register_00000009;
  jx9_value *pjVar3;
  anon_union_8_3_18420de5_for_x aVar4;
  byte *pbVar5;
  jx9_int64 iVal;
  int nLen;
  anon_union_8_3_18420de5_for_x local_38;
  int local_2c;
  
  if (nArg < 1) {
    pjVar3 = pCtx->pRet;
    jx9MemObjRelease(pjVar3);
    (pjVar3->x).iVal = -1;
  }
  else {
    local_38.rVal = 0.0;
    pjVar3 = *apArg;
    if ((pjVar3->iFlags & 1) == 0) {
      jx9MemObjToInteger(pjVar3);
      local_38 = pjVar3->x;
      aVar4 = local_38;
    }
    else {
      zSrc = (byte *)jx9_value_to_string(pjVar3,&local_2c);
      if ((long)local_2c < 1) {
        aVar4.rVal = 0.0;
      }
      else {
        pbVar5 = zSrc + local_2c;
        aVar4.rVal = 0.0;
        do {
          bVar1 = *zSrc;
          if ((ulong)(long)(char)bVar1 < 0xffffffffffffffc0) {
            ppuVar2 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar1 * 2 + 1) & 0x10) != 0) {
              SyHexStrToInt64((char *)zSrc,(int)pbVar5 - (int)zSrc,&local_38,
                              (char **)CONCAT71(in_register_00000009,in_CL));
              aVar4 = local_38;
              break;
            }
          }
          else if (zSrc + 1 < pbVar5) {
            in_CL = -(zSrc[1] & 0xc0);
          }
          zSrc = zSrc + 1;
        } while (zSrc < pbVar5);
      }
    }
    pjVar3 = pCtx->pRet;
    jx9MemObjRelease(pjVar3);
    pjVar3->x = aVar4;
  }
  pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_hexdec(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zEnd;
	jx9_int64 iVal;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	iVal = 0;
	if( jx9_value_is_string(apArg[0]) ){
		/* Extract the given string */
		zString = jx9_value_to_string(apArg[0], &nLen);
		/* Delimit the string */
		zEnd = &zString[nLen];
		/* Ignore non hex-stream */
		while( zString < zEnd ){
			if( (unsigned char)zString[0] >= 0xc0 ){
				/* UTF-8 stream */
				zString++;
				while( zString < zEnd && (((unsigned char)zString[0] & 0xc0) == 0x80) ){
					zString++;
				}
			}else{
				if( SyisHex(zString[0]) ){
					break;
				}
				/* Ignore */
				zString++;
			}
		}
		if( zString < zEnd ){
			/* Cast */
			SyHexStrToInt64(zString, (sxu32)(zEnd-zString), (void *)&iVal, 0);
		}
	}else{
		/* Extract as a 64-bit integer */
		iVal = jx9_value_to_int64(apArg[0]);
	}
	/* Return the number */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}